

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void luaV_finishOp(lua_State *L)

{
  uint uVar1;
  CallInfo *pCVar2;
  int total_00;
  Value *pVVar3;
  StkId pTVar4;
  StkId pTVar5;
  bool local_7e;
  bool local_7d;
  TValue *io2_2;
  TValue *io1_2;
  TValue *io2_1;
  TValue *io1_1;
  int total;
  int b;
  StkId top;
  int res;
  TValue *io2;
  TValue *io1;
  OpCode op;
  Instruction inst;
  StkId base;
  CallInfo *ci;
  lua_State *L_local;
  
  pCVar2 = L->ci;
  pTVar5 = (pCVar2->u).l.base;
  uVar1 = *(uint *)((pCVar2->u).c.old_errfunc + -4);
  switch(uVar1 & 0xff) {
  case 6:
  case 7:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1c:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x70:
  case 0x71:
  case 0x73:
    pVVar3 = &pTVar5[(int)(uVar1 >> 8 & 0x7f)].value_;
    pTVar5 = L->top;
    pTVar4 = pTVar5 + -1;
    L->top = pTVar4;
    *pVVar3 = pTVar4->value_;
    *(LuaType *)(pVVar3 + 1) = pTVar5[-1].tt_;
    if (((ulong)pVVar3[1] & 0x8000) != 0) {
      if (((ulong)pVVar3[1] & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x3f9,"void luaV_finishOp(lua_State *)");
      }
      if ((*(ushort *)(pVVar3 + 1) & 0x7f) != (ushort)pVVar3->gc->tt) {
LAB_001619c8:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x3f9,"void luaV_finishOp(lua_State *)");
      }
      if (L != (lua_State *)0x0) {
        if (((ulong)pVVar3[1] & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x3f9,"void luaV_finishOp(lua_State *)");
        }
        if ((pVVar3->gc->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_001619c8;
      }
    }
    break;
  case 8:
  case 10:
  case 0x25:
  case 0x6c:
  case 0x6f:
  case 0x72:
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x424,"void luaV_finishOp(lua_State *)");
  case 0x1d:
    pTVar4 = L->top;
    total_00 = (int)((long)pTVar4 + (-0x20 - (long)(pTVar5 + (int)(uVar1 >> 0x18))) >> 4);
    pTVar5 = pTVar4 + -3;
    pTVar5->value_ = pTVar4[-1].value_;
    pTVar4[-3].tt_ = pTVar4[-1].tt_;
    if ((pTVar4[-3].tt_ & 0x8000) != 0) {
      if ((pTVar4[-3].tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x40d,"void luaV_finishOp(lua_State *)");
      }
      if ((pTVar4[-3].tt_ & 0x7f) != (ushort)((pTVar5->value_).gc)->tt) {
LAB_00161c67:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x40d,"void luaV_finishOp(lua_State *)");
      }
      if (L != (lua_State *)0x0) {
        if ((pTVar4[-3].tt_ & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x40d,"void luaV_finishOp(lua_State *)");
        }
        if ((((pTVar5->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00161c67;
      }
    }
    if (1 < total_00) {
      L->top = pTVar4 + -2;
      luaV_concat(L,total_00);
    }
    pVVar3 = &(pCVar2->u).l.base[(int)(uVar1 >> 8 & 0x7f)].value_;
    pTVar5 = L->top;
    *pVVar3 = pTVar5[-1].value_;
    *(LuaType *)(pVVar3 + 1) = pTVar5[-1].tt_;
    if (((ulong)pVVar3[1] & 0x8000) != 0) {
      if (((ulong)pVVar3[1] & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x413,"void luaV_finishOp(lua_State *)");
      }
      if ((*(ushort *)(pVVar3 + 1) & 0x7f) != (ushort)pVVar3->gc->tt) {
LAB_00161dbb:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x413,"void luaV_finishOp(lua_State *)");
      }
      if (L != (lua_State *)0x0) {
        if (((ulong)pVVar3[1] & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x413,"void luaV_finishOp(lua_State *)");
        }
        if ((pVVar3->gc->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00161dbb;
      }
    }
    L->top = pCVar2->top;
    break;
  case 0x1f:
  case 0x20:
  case 0x21:
    local_7d = true;
    if (L->top[-1].tt_ != 0) {
      local_7e = false;
      if (L->top[-1].tt_ == 1) {
        if (L->top[-1].tt_ != 1) {
          __assert_fail("((((L->top - 1))->tt_) == (1))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x3fd,"void luaV_finishOp(lua_State *)");
        }
        local_7e = L->top[-1].value_.b == 0;
      }
      local_7d = local_7e;
    }
    top._4_4_ = (uint)((local_7d ^ 0xffU) & 1);
    L->top = L->top + -1;
    if ((pCVar2->callstatus & 0x80) != 0) {
      if ((uVar1 & 0xff) != 0x21) {
        __assert_fail("op == OP_LE",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x400,"void luaV_finishOp(lua_State *)");
      }
      pCVar2->callstatus = pCVar2->callstatus ^ 0x80;
      top._4_4_ = (uint)((top._4_4_ != 0 ^ 0xffU) & 1);
    }
    if ((*(pCVar2->u).l.savedpc & 0xff) != 0x1e) {
      __assert_fail("((OpCode)(((*ci->u.l.savedpc)&0xff))) == OP_JMP",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x404,"void luaV_finishOp(lua_State *)");
    }
    if (top._4_4_ != (uVar1 >> 8 & 0x7f)) {
      (pCVar2->u).l.savedpc = (Instruction *)((pCVar2->u).c.old_errfunc + 4);
    }
    break;
  case 0x24:
    if (-1 < (int)((uVar1 >> 0x10 & 0xff) - 1)) {
      L->top = pCVar2->top;
    }
    break;
  case 0x29:
    if ((*(pCVar2->u).l.savedpc & 0xff) != 0x2a) {
      __assert_fail("((OpCode)(((*ci->u.l.savedpc)&0xff))) == OP_TFORLOOP",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x418,"void luaV_finishOp(lua_State *)");
    }
    L->top = pCVar2->top;
  }
  return;
}

Assistant:

void luaV_finishOp (lua_State *L) {
  CallInfo *ci = L->ci;
  StkId base = ci->u.l.base;
  Instruction inst = *(ci->u.l.savedpc - 1);  /* interrupted instruction */
  OpCode op = GET_OPCODE(inst);
  switch (op) {  /* finish its execution */
    case OP_ADD: case OP_SUB: case OP_MUL: case OP_DIV: case OP_IDIV:
    case OP_BAND: case OP_BOR: case OP_BXOR: case OP_SHL: case OP_SHR:
    case OP_MOD: case OP_POW:
    case OP_UNM: case OP_BNOT: case OP_LEN:
    case OP_RAVI_GETTABUP_SK: 
    case OP_RAVI_GETFIELD: case OP_RAVI_GETI: case OP_RAVI_TABLE_GETFIELD: 
    case OP_RAVI_SELF_SK: case OP_RAVI_TABLE_SELF_SK:
    case OP_GETTABUP: case OP_GETTABLE: case OP_SELF: {
      setobjs2s(L, base + GETARG_A(inst), --L->top);
      break;
    }
    case OP_LE: case OP_LT: case OP_EQ: {
      int res = !l_isfalse(L->top - 1);
      L->top--;
      if (ci->callstatus & CIST_LEQ) {  /* "<=" using "<" instead? */
        lua_assert(op == OP_LE);
        ci->callstatus ^= CIST_LEQ;  /* clear mark */
        res = !res;  /* negate result */
      }
      lua_assert(GET_OPCODE(*ci->u.l.savedpc) == OP_JMP);
      if (res != GETARG_A(inst))  /* condition failed? */
        ci->u.l.savedpc++;  /* skip jump instruction */
      break;
    }
    case OP_CONCAT: {
      StkId top = L->top - 1;  /* top when 'luaT_trybinTM' was called */
      int b = GETARG_B(inst);      /* first element to concatenate */
      int total = cast_int(top - 1 - (base + b));  /* yet to concatenate */
      setobj2s(L, top - 2, top);  /* put TM result in proper position */
      if (total > 1) {  /* are there elements to concat? */
        L->top = top - 1;  /* top is one after last element (at top-2) */
        luaV_concat(L, total);  /* concat them (may yield again) */
      }
      /* move final result to final position */
      setobj2s(L, ci->u.l.base + GETARG_A(inst), L->top - 1);
      L->top = ci->top;  /* restore top */
      break;
    }
    case OP_TFORCALL: {
      lua_assert(GET_OPCODE(*ci->u.l.savedpc) == OP_TFORLOOP);
      L->top = ci->top;  /* correct top */
      break;
    }
    case OP_CALL: {
      if (GETARG_C(inst) - 1 >= 0)  /* nresults >= 0? */
        L->top = ci->top;  /* adjust results */
      break;
    }
    case OP_RAVI_SETI: case OP_RAVI_TABLE_SETFIELD: case OP_RAVI_SETFIELD:
    case OP_TAILCALL: case OP_SETTABUP: case OP_SETTABLE:
      break;
    default: lua_assert(0);
  }
}